

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Swap_Test<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Swap_Test<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  hasher *hf;
  key_equal *eql;
  HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *this_01;
  int iVar2;
  long in_RDI;
  int i_2;
  TypeParam empty_ht;
  int i_1;
  TypeParam swap_to_clear_ht;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_type expected_buckets;
  int i;
  TypeParam other_ht;
  hasher hasher;
  BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff238;
  BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff240;
  HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff248;
  BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff250;
  key_equal *in_stack_fffffffffffff258;
  int iVar3;
  hasher *in_stack_fffffffffffff260;
  char *in_stack_fffffffffffff268;
  HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff270;
  char *in_stack_fffffffffffff2a0;
  undefined4 in_stack_fffffffffffff2a8;
  undefined4 in_stack_fffffffffffff2ac;
  value_type *in_stack_fffffffffffff2b8;
  BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff2c0;
  int local_b6c;
  string local_b68 [32];
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  local_b48;
  Hasher local_b38;
  Hasher local_b2c [25];
  int local_9fc;
  string local_9f8 [32];
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  local_9d8;
  Hasher local_9c8;
  Hasher local_9bc [17];
  string local_8e8 [32];
  HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *local_8c8;
  undefined4 local_8bc;
  AssertionResult local_8b8 [2];
  string local_898 [32];
  key_equal *local_878;
  undefined4 local_86c;
  AssertionResult local_868 [2];
  HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  *local_848;
  undefined4 local_83c;
  AssertionResult local_838 [2];
  size_type local_818;
  undefined4 local_80c;
  AssertionResult local_808 [2];
  hasher local_7e8;
  hasher local_7d8;
  int local_7c8;
  undefined4 local_7c4;
  AssertionResult local_7c0 [2];
  hasher local_7a0;
  hasher local_790;
  int local_780;
  undefined4 local_77c;
  AssertionResult local_778 [2];
  string local_758 [32];
  string local_738 [32];
  AssertionResult local_718 [2];
  string local_6f8 [32];
  string local_6d8 [32];
  AssertionResult local_6b8 [2];
  string local_698 [32];
  size_type local_678;
  undefined4 local_66c;
  AssertionResult local_668 [2];
  string local_648 [32];
  size_type local_628;
  undefined4 local_61c;
  AssertionResult local_618 [2];
  string local_5f8 [32];
  size_type local_5d8;
  undefined4 local_5cc;
  AssertionResult local_5c8 [2];
  string local_5a8 [32];
  size_type local_588;
  undefined4 local_57c;
  AssertionResult local_578 [2];
  string local_558 [32];
  size_type local_538;
  undefined4 local_52c;
  AssertionResult local_528 [2];
  string local_508 [32];
  size_type local_4e8;
  undefined4 local_4dc;
  AssertionResult local_4d8 [2];
  size_type local_4b8;
  undefined4 local_4ac;
  AssertionResult local_4a8 [2];
  size_type local_488;
  undefined4 local_47c;
  AssertionResult local_478 [2];
  undefined4 local_454;
  size_type local_450;
  AssertionResult local_448 [2];
  size_type local_428;
  AssertionResult local_420 [2];
  key_equal local_400;
  key_equal local_3f0;
  int local_3e0;
  undefined4 local_3dc;
  AssertionResult local_3d8 [2];
  key_equal local_3b8;
  key_equal local_3a8;
  int local_398;
  undefined4 local_394;
  AssertionResult local_390 [2];
  hasher local_370;
  hasher local_360;
  int local_350;
  undefined4 local_34c;
  AssertionResult local_348 [2];
  hasher local_328;
  hasher local_318;
  int local_308;
  undefined4 local_304;
  AssertionResult local_300 [2];
  string local_2e0 [32];
  string local_2c0 [32];
  AssertionResult local_2a0 [2];
  string local_280 [32];
  string local_260 [32];
  AssertionResult local_240;
  size_type local_230;
  string local_1c0 [140];
  int local_134;
  string local_130 [32];
  string local_110 [48];
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  local_e0 [12];
  Hasher local_14;
  
  Hasher::Hasher(&local_14,1);
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  ::Alloc(local_e0,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            (in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268,
             in_stack_fffffffffffff260,in_stack_fffffffffffff258,
             (allocator_type *)in_stack_fffffffffffff250);
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  ::~Alloc(local_e0);
  HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),
              (int)((ulong)in_stack_fffffffffffff2a0 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffff240,(key_type *)in_stack_fffffffffffff238);
  std::__cxx11::string::~string(local_110);
  HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),
              (int)((ulong)in_stack_fffffffffffff2a0 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffff240,(key_type *)in_stack_fffffffffffff238);
  std::__cxx11::string::~string(local_130);
  for (local_134 = 3; local_134 < 2000; local_134 = local_134 + 1) {
    HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(in_stack_fffffffffffff248,(int)((ulong)in_stack_fffffffffffff240 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffff240);
  }
  HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),
              (int)((ulong)in_stack_fffffffffffff2a0 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(in_stack_fffffffffffff240,(key_type *)in_stack_fffffffffffff238);
  std::__cxx11::string::~string(local_1c0);
  HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_fffffffffffff248,(int)((ulong)in_stack_fffffffffffff240 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)in_stack_fffffffffffff240);
  local_230 = google::
              BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xbecd82);
  google::
  BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::swap(in_stack_fffffffffffff240,in_stack_fffffffffffff238);
  HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),
              (int)((ulong)in_stack_fffffffffffff2a0 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::deleted_key(in_stack_fffffffffffff238);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((char *)in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff248,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff240);
  std::__cxx11::string::~string(local_280);
  std::__cxx11::string::~string(local_260);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_240);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff270);
    testing::AssertionResult::failure_message((AssertionResult *)0xbecf01);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff270,
               (Type)((ulong)in_stack_fffffffffffff268 >> 0x20),(char *)in_stack_fffffffffffff260,
               (int)((ulong)in_stack_fffffffffffff258 >> 0x20),(char *)in_stack_fffffffffffff250);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff2c0,(Message *)in_stack_fffffffffffff2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff240);
    testing::Message::~Message((Message *)0xbecf64);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbecfd5);
  HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),
              (int)((ulong)in_stack_fffffffffffff2a0 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::deleted_key(in_stack_fffffffffffff238);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((char *)in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff248,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff240);
  std::__cxx11::string::~string(local_2e0);
  std::__cxx11::string::~string(local_2c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff270);
    testing::AssertionResult::failure_message((AssertionResult *)0xbed0de);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff270,
               (Type)((ulong)in_stack_fffffffffffff268 >> 0x20),(char *)in_stack_fffffffffffff260,
               (int)((ulong)in_stack_fffffffffffff258 >> 0x20),(char *)in_stack_fffffffffffff250);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff2c0,(Message *)in_stack_fffffffffffff2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff240);
    testing::Message::~Message((Message *)0xbed141);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbed1b2);
  local_304 = 1;
  local_328 = google::
              BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_fffffffffffff250);
  local_318 = local_328;
  local_308 = Hasher::id(&local_318);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,
             (int *)in_stack_fffffffffffff248,(int *)in_stack_fffffffffffff240);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_300);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff270);
    testing::AssertionResult::failure_message((AssertionResult *)0xbed2a2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff270,
               (Type)((ulong)in_stack_fffffffffffff268 >> 0x20),(char *)in_stack_fffffffffffff260,
               (int)((ulong)in_stack_fffffffffffff258 >> 0x20),(char *)in_stack_fffffffffffff250);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff2c0,(Message *)in_stack_fffffffffffff2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff240);
    testing::Message::~Message((Message *)0xbed305);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbed376);
  local_34c = 0;
  local_370 = google::
              BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_fffffffffffff250);
  local_360 = local_370;
  local_350 = Hasher::id(&local_360);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,
             (int *)in_stack_fffffffffffff248,(int *)in_stack_fffffffffffff240);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_348);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff270);
    testing::AssertionResult::failure_message((AssertionResult *)0xbed462);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff270,
               (Type)((ulong)in_stack_fffffffffffff268 >> 0x20),(char *)in_stack_fffffffffffff260,
               (int)((ulong)in_stack_fffffffffffff258 >> 0x20),(char *)in_stack_fffffffffffff250);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff2c0,(Message *)in_stack_fffffffffffff2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff240);
    testing::Message::~Message((Message *)0xbed4c5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbed536);
  local_394 = 1;
  local_3b8 = google::
              BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_fffffffffffff250);
  local_3a8 = local_3b8;
  local_398 = Hasher::id(&local_3a8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,
             (int *)in_stack_fffffffffffff248,(int *)in_stack_fffffffffffff240);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_390);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff270);
    testing::AssertionResult::failure_message((AssertionResult *)0xbed626);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff270,
               (Type)((ulong)in_stack_fffffffffffff268 >> 0x20),(char *)in_stack_fffffffffffff260,
               (int)((ulong)in_stack_fffffffffffff258 >> 0x20),(char *)in_stack_fffffffffffff250);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff2c0,(Message *)in_stack_fffffffffffff2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff240);
    testing::Message::~Message((Message *)0xbed689);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbed6fa);
  local_3dc = 0;
  local_400 = google::
              BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_fffffffffffff250);
  local_3f0 = local_400;
  local_3e0 = Hasher::id(&local_3f0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,
             (int *)in_stack_fffffffffffff248,(int *)in_stack_fffffffffffff240);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff270);
    testing::AssertionResult::failure_message((AssertionResult *)0xbed7e6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff270,
               (Type)((ulong)in_stack_fffffffffffff268 >> 0x20),(char *)in_stack_fffffffffffff260,
               (int)((ulong)in_stack_fffffffffffff258 >> 0x20),(char *)in_stack_fffffffffffff250);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff2c0,(Message *)in_stack_fffffffffffff2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff240);
    testing::Message::~Message((Message *)0xbed849);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbed8b7);
  local_428 = google::
              BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xbed8c8);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,
             (unsigned_long *)in_stack_fffffffffffff248,(unsigned_long *)in_stack_fffffffffffff240);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_420);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff270);
    testing::AssertionResult::failure_message((AssertionResult *)0xbed955);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff270,
               (Type)((ulong)in_stack_fffffffffffff268 >> 0x20),(char *)in_stack_fffffffffffff260,
               (int)((ulong)in_stack_fffffffffffff258 >> 0x20),(char *)in_stack_fffffffffffff250);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff2c0,(Message *)in_stack_fffffffffffff2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff240);
    testing::Message::~Message((Message *)0xbed9b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbeda29);
  local_450 = google::
              BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xbeda36);
  local_454 = 200;
  testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
            ((char *)in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,
             (unsigned_long *)in_stack_fffffffffffff248,(uint *)in_stack_fffffffffffff240);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_448);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff270);
    testing::AssertionResult::failure_message((AssertionResult *)0xbedace);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff270,
               (Type)((ulong)in_stack_fffffffffffff268 >> 0x20),(char *)in_stack_fffffffffffff260,
               (int)((ulong)in_stack_fffffffffffff258 >> 0x20),(char *)in_stack_fffffffffffff250);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff2c0,(Message *)in_stack_fffffffffffff2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff240);
    testing::Message::~Message((Message *)0xbedb31);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbedba2);
  local_47c = 1;
  local_488 = google::
              BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xbedbbe);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,
             (uint *)in_stack_fffffffffffff248,(unsigned_long *)in_stack_fffffffffffff240);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_478);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff270);
    testing::AssertionResult::failure_message((AssertionResult *)0xbedc4b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff270,
               (Type)((ulong)in_stack_fffffffffffff268 >> 0x20),(char *)in_stack_fffffffffffff260,
               (int)((ulong)in_stack_fffffffffffff258 >> 0x20),(char *)in_stack_fffffffffffff250);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff2c0,(Message *)in_stack_fffffffffffff2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff240);
    testing::Message::~Message((Message *)0xbedcae);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbedd1f);
  local_4ac = 0x7cc;
  local_4b8 = google::
              BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xbedd37);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,
             (uint *)in_stack_fffffffffffff248,(unsigned_long *)in_stack_fffffffffffff240);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff270);
    testing::AssertionResult::failure_message((AssertionResult *)0xbeddc4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff270,
               (Type)((ulong)in_stack_fffffffffffff268 >> 0x20),(char *)in_stack_fffffffffffff260,
               (int)((ulong)in_stack_fffffffffffff258 >> 0x20),(char *)in_stack_fffffffffffff250);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff2c0,(Message *)in_stack_fffffffffffff2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff240);
    testing::Message::~Message((Message *)0xbede27);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbede98);
  local_4dc = 0;
  HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),
              (int)((ulong)in_stack_fffffffffffff2a0 >> 0x20));
  local_4e8 = google::
              BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffff240,(key_type *)in_stack_fffffffffffff238);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,
             (uint *)in_stack_fffffffffffff248,(unsigned_long *)in_stack_fffffffffffff240);
  std::__cxx11::string::~string(local_508);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff270);
    testing::AssertionResult::failure_message((AssertionResult *)0xbedfa3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff270,
               (Type)((ulong)in_stack_fffffffffffff268 >> 0x20),(char *)in_stack_fffffffffffff260,
               (int)((ulong)in_stack_fffffffffffff258 >> 0x20),(char *)in_stack_fffffffffffff250);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff2c0,(Message *)in_stack_fffffffffffff2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff240);
    testing::Message::~Message((Message *)0xbee006);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbee077);
  local_52c = 1;
  HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),
              (int)((ulong)in_stack_fffffffffffff2a0 >> 0x20));
  local_538 = google::
              BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffff240,(key_type *)in_stack_fffffffffffff238);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,
             (uint *)in_stack_fffffffffffff248,(unsigned_long *)in_stack_fffffffffffff240);
  std::__cxx11::string::~string(local_558);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_528);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff270);
    testing::AssertionResult::failure_message((AssertionResult *)0xbee173);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff270,
               (Type)((ulong)in_stack_fffffffffffff268 >> 0x20),(char *)in_stack_fffffffffffff260,
               (int)((ulong)in_stack_fffffffffffff258 >> 0x20),(char *)in_stack_fffffffffffff250);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff2c0,(Message *)in_stack_fffffffffffff2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff240);
    testing::Message::~Message((Message *)0xbee1d6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbee247);
  local_57c = 1;
  HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),
              (int)((ulong)in_stack_fffffffffffff2a0 >> 0x20));
  local_588 = google::
              BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffff240,(key_type *)in_stack_fffffffffffff238);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,
             (uint *)in_stack_fffffffffffff248,(unsigned_long *)in_stack_fffffffffffff240);
  std::__cxx11::string::~string(local_5a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_578);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff270);
    testing::AssertionResult::failure_message((AssertionResult *)0xbee352);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff270,
               (Type)((ulong)in_stack_fffffffffffff268 >> 0x20),(char *)in_stack_fffffffffffff260,
               (int)((ulong)in_stack_fffffffffffff258 >> 0x20),(char *)in_stack_fffffffffffff250);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff2c0,(Message *)in_stack_fffffffffffff2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff240);
    testing::Message::~Message((Message *)0xbee3b5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbee426);
  local_5cc = 0;
  HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),
              (int)((ulong)in_stack_fffffffffffff2a0 >> 0x20));
  local_5d8 = google::
              BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffff240,(key_type *)in_stack_fffffffffffff238);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,
             (uint *)in_stack_fffffffffffff248,(unsigned_long *)in_stack_fffffffffffff240);
  std::__cxx11::string::~string(local_5f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff270);
    testing::AssertionResult::failure_message((AssertionResult *)0xbee522);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff270,
               (Type)((ulong)in_stack_fffffffffffff268 >> 0x20),(char *)in_stack_fffffffffffff260,
               (int)((ulong)in_stack_fffffffffffff258 >> 0x20),(char *)in_stack_fffffffffffff250);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff2c0,(Message *)in_stack_fffffffffffff2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff240);
    testing::Message::~Message((Message *)0xbee585);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbee5f6);
  local_61c = 0;
  HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),
              (int)((ulong)in_stack_fffffffffffff2a0 >> 0x20));
  local_628 = google::
              BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffff240,(key_type *)in_stack_fffffffffffff238);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,
             (uint *)in_stack_fffffffffffff248,(unsigned_long *)in_stack_fffffffffffff240);
  std::__cxx11::string::~string(local_648);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_618);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff270);
    testing::AssertionResult::failure_message((AssertionResult *)0xbee701);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff270,
               (Type)((ulong)in_stack_fffffffffffff268 >> 0x20),(char *)in_stack_fffffffffffff260,
               (int)((ulong)in_stack_fffffffffffff258 >> 0x20),(char *)in_stack_fffffffffffff250);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff2c0,(Message *)in_stack_fffffffffffff2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff240);
    testing::Message::~Message((Message *)0xbee764);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbee7d5);
  local_66c = 0;
  HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),
              (int)((ulong)in_stack_fffffffffffff2a0 >> 0x20));
  local_678 = google::
              BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffff240,(key_type *)in_stack_fffffffffffff238);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,
             (uint *)in_stack_fffffffffffff248,(unsigned_long *)in_stack_fffffffffffff240);
  std::__cxx11::string::~string(local_698);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_668);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff270);
    testing::AssertionResult::failure_message((AssertionResult *)0xbee8d1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff270,
               (Type)((ulong)in_stack_fffffffffffff268 >> 0x20),(char *)in_stack_fffffffffffff260,
               (int)((ulong)in_stack_fffffffffffff258 >> 0x20),(char *)in_stack_fffffffffffff250);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff2c0,(Message *)in_stack_fffffffffffff2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff240);
    testing::Message::~Message((Message *)0xbee934);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbee9a5);
  google::
  swap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
            ((HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *)in_stack_fffffffffffff240,
             (HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *)in_stack_fffffffffffff238);
  HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),
              (int)((ulong)in_stack_fffffffffffff2a0 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::deleted_key(in_stack_fffffffffffff238);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((char *)in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff248,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff240);
  std::__cxx11::string::~string(local_6f8);
  std::__cxx11::string::~string(local_6d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff270);
    in_stack_fffffffffffff2c0 =
         (BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xbeeacd);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff270,
               (Type)((ulong)in_stack_fffffffffffff268 >> 0x20),(char *)in_stack_fffffffffffff260,
               (int)((ulong)in_stack_fffffffffffff258 >> 0x20),(char *)in_stack_fffffffffffff250);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff2c0,(Message *)in_stack_fffffffffffff2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff240);
    testing::Message::~Message((Message *)0xbeeb30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbeeba1);
  HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),
              (int)((ulong)in_stack_fffffffffffff2a0 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::deleted_key(in_stack_fffffffffffff238);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((char *)in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff248,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff240);
  std::__cxx11::string::~string(local_758);
  std::__cxx11::string::~string(local_738);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_718);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff270);
    in_stack_fffffffffffff2b8 =
         (value_type *)testing::AssertionResult::failure_message((AssertionResult *)0xbeecaa);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff270,
               (Type)((ulong)in_stack_fffffffffffff268 >> 0x20),(char *)in_stack_fffffffffffff260,
               (int)((ulong)in_stack_fffffffffffff258 >> 0x20),(char *)in_stack_fffffffffffff250);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff2c0,(Message *)in_stack_fffffffffffff2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff240);
    testing::Message::~Message((Message *)0xbeed0d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbeed7e);
  local_77c = 0;
  local_7a0 = google::
              BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_fffffffffffff250);
  iVar2 = local_7a0.num_compares_;
  local_790 = local_7a0;
  local_780 = Hasher::id(&local_790);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,
             (int *)in_stack_fffffffffffff248,(int *)in_stack_fffffffffffff240);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_778);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff270);
    in_stack_fffffffffffff2a0 =
         testing::AssertionResult::failure_message((AssertionResult *)0xbeee62);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff270,
               (Type)((ulong)in_stack_fffffffffffff268 >> 0x20),(char *)in_stack_fffffffffffff260,
               (int)((ulong)in_stack_fffffffffffff258 >> 0x20),(char *)in_stack_fffffffffffff250);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff2c0,(Message *)in_stack_fffffffffffff2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff240);
    testing::Message::~Message((Message *)0xbeeebf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbeef30);
  local_7c4 = 1;
  local_7e8 = google::
              BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_fffffffffffff250);
  local_7d8 = local_7e8;
  local_7c8 = Hasher::id(&local_7d8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,
             (int *)in_stack_fffffffffffff248,(int *)in_stack_fffffffffffff240);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_7c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff270);
    testing::AssertionResult::failure_message((AssertionResult *)0xbef010);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff270,
               (Type)((ulong)in_stack_fffffffffffff268 >> 0x20),(char *)in_stack_fffffffffffff260,
               (int)((ulong)in_stack_fffffffffffff258 >> 0x20),(char *)in_stack_fffffffffffff250);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff2c0,(Message *)in_stack_fffffffffffff2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff240);
    testing::Message::~Message((Message *)0xbef06d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbef0de);
  local_80c = 0x7cc;
  local_818 = google::
              BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xbef0fa);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,
             (uint *)in_stack_fffffffffffff248,(unsigned_long *)in_stack_fffffffffffff240);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_808);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff270);
    testing::AssertionResult::failure_message((AssertionResult *)0xbef181);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff270,
               (Type)((ulong)in_stack_fffffffffffff268 >> 0x20),(char *)in_stack_fffffffffffff260,
               (int)((ulong)in_stack_fffffffffffff258 >> 0x20),(char *)in_stack_fffffffffffff250);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff2c0,(Message *)in_stack_fffffffffffff2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff240);
    testing::Message::~Message((Message *)0xbef1de);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbef24c);
  local_83c = 1;
  this_00 = (HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
             *)google::
               BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               ::size((BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                       *)0xbef264);
  local_848 = this_00;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,
             (uint *)in_stack_fffffffffffff248,(unsigned_long *)in_stack_fffffffffffff240);
  iVar3 = (int)((ulong)in_stack_fffffffffffff258 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_838);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffff268 =
         testing::AssertionResult::failure_message((AssertionResult *)0xbef2eb);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,(Type)((ulong)in_stack_fffffffffffff268 >> 0x20),
               (char *)in_stack_fffffffffffff260,iVar3,(char *)in_stack_fffffffffffff250);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff2c0,(Message *)in_stack_fffffffffffff2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff240);
    testing::Message::~Message((Message *)0xbef348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbef3b9);
  local_86c = 1;
  hf = (hasher *)(in_RDI + 0x10);
  HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               *)CONCAT44(iVar2,in_stack_fffffffffffff2a8),
              (int)((ulong)in_stack_fffffffffffff2a0 >> 0x20));
  eql = (key_equal *)
        google::
        BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
        ::count(in_stack_fffffffffffff240,(key_type *)in_stack_fffffffffffff238);
  local_878 = eql;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)eql,(char *)in_stack_fffffffffffff250,(uint *)in_stack_fffffffffffff248,
             (unsigned_long *)in_stack_fffffffffffff240);
  std::__cxx11::string::~string(local_898);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_868);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffff250 =
         (BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xbef4b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,(Type)((ulong)in_stack_fffffffffffff268 >> 0x20),(char *)hf,
               (int)((ulong)eql >> 0x20),(char *)in_stack_fffffffffffff250);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff2c0,(Message *)in_stack_fffffffffffff2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff240);
    testing::Message::~Message((Message *)0xbef515);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbef586);
  local_8bc = 0;
  HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               *)CONCAT44(iVar2,in_stack_fffffffffffff2a8),
              (int)((ulong)in_stack_fffffffffffff2a0 >> 0x20));
  this_01 = (HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
             *)google::
               BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               ::count(in_stack_fffffffffffff240,(key_type *)in_stack_fffffffffffff238);
  local_8c8 = this_01;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)eql,(char *)in_stack_fffffffffffff250,(uint *)this_01,
             (unsigned_long *)in_stack_fffffffffffff240);
  std::__cxx11::string::~string(local_8e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_8b8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffff240 =
         (BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xbef67c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,(Type)((ulong)in_stack_fffffffffffff268 >> 0x20),(char *)hf,
               (int)((ulong)eql >> 0x20),(char *)in_stack_fffffffffffff250);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff2c0,(Message *)in_stack_fffffffffffff2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff240);
    testing::Message::~Message((Message *)0xbef6d9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbef74a);
  Hasher::Hasher(local_9bc,0);
  Hasher::Hasher(&local_9c8,0);
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  ::Alloc(&local_9d8,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            (this_00,(size_type)in_stack_fffffffffffff268,hf,eql,
             (allocator_type *)in_stack_fffffffffffff250);
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  ::~Alloc(&local_9d8);
  HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               *)CONCAT44(iVar2,in_stack_fffffffffffff2a8),
              (int)((ulong)in_stack_fffffffffffff2a0 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffff240,(key_type *)in_stack_fffffffffffff238);
  std::__cxx11::string::~string(local_9f8);
  for (local_9fc = 2; iVar3 = (int)((ulong)in_stack_fffffffffffff2a0 >> 0x20), local_9fc < 10000;
      local_9fc = local_9fc + 1) {
    HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(this_01,(int)((ulong)in_stack_fffffffffffff240 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffff240);
  }
  Hasher::Hasher(local_b2c,0);
  Hasher::Hasher(&local_b38,0);
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  ::Alloc(&local_b48,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            (this_00,(size_type)in_stack_fffffffffffff268,hf,eql,
             (allocator_type *)in_stack_fffffffffffff250);
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  ::~Alloc(&local_b48);
  google::
  BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::swap(in_stack_fffffffffffff240,in_stack_fffffffffffff238);
  HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               *)CONCAT44(iVar2,in_stack_fffffffffffff2a8),iVar3);
  google::
  BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffff240,(key_type *)in_stack_fffffffffffff238);
  std::__cxx11::string::~string(local_b68);
  for (local_b6c = 2; local_b6c < 10000; local_b6c = local_b6c + 1) {
    HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(this_01,(int)((ulong)in_stack_fffffffffffff240 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffff240);
  }
  google::
  HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *)0xbefad9);
  google::
  HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *)0xbefae6);
  google::
  HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *)0xbefaf3);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Swap) {
  // Let's make a second hashtable with its own hasher, key_equal, etc.
  typename TypeParam::hasher hasher(1);  // 1 is a unique id
  TypeParam other_ht(200, hasher, hasher);

  this->ht_.set_deleted_key(this->UniqueKey(1));
  other_ht.set_deleted_key(this->UniqueKey(2));

  for (int i = 3; i < 2000; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  this->ht_.erase(this->UniqueKey(1000));
  other_ht.insert(this->UniqueObject(2001));
  typename TypeParam::size_type expected_buckets = other_ht.bucket_count();

  this->ht_.swap(other_ht);

  EXPECT_EQ(this->UniqueKey(2), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(1), other_ht.deleted_key());

  EXPECT_EQ(1, this->ht_.hash_funct().id());
  EXPECT_EQ(0, other_ht.hash_funct().id());

  EXPECT_EQ(1, this->ht_.key_eq().id());
  EXPECT_EQ(0, other_ht.key_eq().id());

  EXPECT_EQ(expected_buckets, this->ht_.bucket_count());
  EXPECT_GT(other_ht.bucket_count(), 200u);

  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(1996u, other_ht.size());  // because we erased 1000

  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, other_ht.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1000)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(1000)));

// We purposefully don't swap allocs -- they're not necessarily swappable.

// Now swap back, using the free-function swap
// NOTE: MSVC seems to have trouble with this free swap, not quite
// sure why.  I've given up trying to fix it though.
#ifdef _MSC_VER
  other_ht.swap(this->ht_);
#else
  swap(this->ht_, other_ht);
#endif

  EXPECT_EQ(this->UniqueKey(1), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(2), other_ht.deleted_key());
  EXPECT_EQ(0, this->ht_.hash_funct().id());
  EXPECT_EQ(1, other_ht.hash_funct().id());
  EXPECT_EQ(1996u, this->ht_.size());
  EXPECT_EQ(1u, other_ht.size());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(111)));

  // A user reported a crash with this code using swap to clear.
  // We've since fixed the bug; this prevents a regression.
  TypeParam swap_to_clear_ht;
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
  TypeParam empty_ht;
  empty_ht.swap(swap_to_clear_ht);
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
}